

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_converter.cpp
# Opt level: O1

bool __thiscall dxil_spv::Converter::Impl::emit_global_heaps(Impl *this)

{
  uint uVar1;
  AnnotateHandleReference *pAVar2;
  AnnotateHandleReference *pAVar3;
  ResourceRemappingInterface *pRVar4;
  pointer ptr;
  long lVar5;
  undefined2 uVar6;
  iterator iVar7;
  byte bVar8;
  ComponentType actual_component_type;
  char cVar9;
  bool bVar10;
  ResourceKind RVar11;
  uint uVar12;
  int iVar13;
  Id IVar14;
  ulong uVar15;
  LoggingCallback p_Var16;
  void *pvVar17;
  bool bVar18;
  BindlessInfo *info;
  _Hash_node_base *p_Var19;
  AnnotateHandleReference **ppAVar20;
  __normal_iterator<dxil_spv::Converter::Impl::AnnotateHandleReference_**,_std::vector<dxil_spv::Converter::Impl::AnnotateHandleReference_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::AnnotateHandleReference_*>_>_>
  __i;
  long lVar21;
  AnnotateHandleReference **ppAVar22;
  bool bVar23;
  AliasedAccess aliased_access;
  VulkanBinding vulkan_binding;
  Vector<AnnotateHandleReference_*> annotations;
  D3DBinding d3d_binding;
  VulkanSRVBinding vulkan_srv_binding;
  BindlessInfo local_1118;
  undefined1 local_10e8 [8];
  undefined8 uStack_10e0;
  pointer local_10d8;
  bool bStack_10d0;
  bool bStack_10cf;
  bool bStack_10ce;
  undefined1 uStack_10cd;
  uint32_t uStack_10cc;
  uint uStack_10c8;
  AnnotateHandleReference *local_10b8;
  pointer pRStack_10b0;
  undefined8 local_10a8;
  AnnotateHandleReference **local_1098;
  iterator iStack_1090;
  AnnotateHandleReference **local_1088;
  ShaderStage local_107c;
  undefined4 uStack_1078;
  undefined8 uStack_1074;
  undefined8 uStack_106c;
  uint uStack_1064;
  AnnotateHandleReference **local_1060;
  ShaderStage local_1058;
  undefined4 uStack_1054;
  undefined4 uStack_1050;
  undefined4 uStack_104c;
  undefined4 uStack_1048;
  undefined4 uStack_1044;
  uint uStack_1040;
  uint local_103c;
  undefined1 local_1038 [8];
  pointer pRStack_1030;
  pointer local_1028;
  VulkanBinding VStack_1020;
  VulkanBinding local_1008 [169];
  
  local_1098 = (AnnotateHandleReference **)0x0;
  iStack_1090._M_current = (AnnotateHandleReference **)0x0;
  local_1088 = (AnnotateHandleReference **)0x0;
  p_Var19 = (this->llvm_annotate_handle_uses)._M_h._M_before_begin._M_nxt;
  if (p_Var19 != (_Hash_node_base *)0x0) {
    do {
      local_1038 = (undefined1  [8])(p_Var19 + 2);
      if (iStack_1090._M_current == local_1088) {
        std::
        vector<dxil_spv::Converter::Impl::AnnotateHandleReference*,dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::AnnotateHandleReference*>>
        ::_M_realloc_insert<dxil_spv::Converter::Impl::AnnotateHandleReference*>
                  ((vector<dxil_spv::Converter::Impl::AnnotateHandleReference*,dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::AnnotateHandleReference*>>
                    *)&local_1098,iStack_1090,(AnnotateHandleReference **)local_1038);
      }
      else {
        *iStack_1090._M_current = (AnnotateHandleReference *)local_1038;
        iStack_1090._M_current = iStack_1090._M_current + 1;
      }
      p_Var19 = p_Var19->_M_nxt;
    } while (p_Var19 != (_Hash_node_base *)0x0);
  }
  iVar7._M_current = iStack_1090._M_current;
  ppAVar20 = local_1098;
  if (local_1098 != iStack_1090._M_current) {
    lVar21 = (long)iStack_1090._M_current - (long)local_1098;
    uVar15 = lVar21 >> 3;
    lVar5 = 0x3f;
    if (uVar15 != 0) {
      for (; uVar15 >> lVar5 == 0; lVar5 = lVar5 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<dxil_spv::Converter::Impl::AnnotateHandleReference**,std::vector<dxil_spv::Converter::Impl::AnnotateHandleReference*,dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::AnnotateHandleReference*>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<dxil_spv::Converter::Impl::emit_global_heaps()::__0>>
              (local_1098,iStack_1090._M_current,((uint)lVar5 ^ 0x3f) * 2 ^ 0x7e);
    if (lVar21 < 0x81) {
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<dxil_spv::Converter::Impl::AnnotateHandleReference**,std::vector<dxil_spv::Converter::Impl::AnnotateHandleReference*,dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::AnnotateHandleReference*>>>,__gnu_cxx::__ops::_Iter_comp_iter<dxil_spv::Converter::Impl::emit_global_heaps()::__0>>
                (ppAVar20,iVar7._M_current);
    }
    else {
      ppAVar22 = ppAVar20 + 0x10;
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<dxil_spv::Converter::Impl::AnnotateHandleReference**,std::vector<dxil_spv::Converter::Impl::AnnotateHandleReference*,dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::AnnotateHandleReference*>>>,__gnu_cxx::__ops::_Iter_comp_iter<dxil_spv::Converter::Impl::emit_global_heaps()::__0>>
                (ppAVar20,ppAVar22);
      for (; ppAVar22 != iVar7._M_current; ppAVar22 = ppAVar22 + 1) {
        pAVar2 = ppAVar22[-1];
        pAVar3 = *ppAVar22;
        uVar1 = pAVar3->ordinal;
        uVar12 = pAVar2->ordinal;
        ppAVar20 = ppAVar22;
        while (uVar1 < uVar12) {
          *ppAVar20 = pAVar2;
          pAVar2 = ppAVar20[-2];
          ppAVar20 = ppAVar20 + -1;
          uVar12 = pAVar2->ordinal;
        }
        *ppAVar20 = pAVar3;
      }
    }
  }
  local_1060 = iStack_1090._M_current;
  bVar23 = local_1098 == iStack_1090._M_current;
  ppAVar20 = local_1098;
  do {
    if (bVar23) {
switchD_0011a91b_default:
      if (local_1098 != (AnnotateHandleReference **)0x0) {
        free_in_thread(local_1098);
      }
      return bVar23;
    }
    pAVar2 = *ppAVar20;
    local_10d8 = (pointer)0x0;
    bStack_10d0 = false;
    bStack_10cf = false;
    uStack_10cd = 0;
    uStack_10cc = 0;
    uStack_10e0._0_1_ = Invalid;
    uStack_10e0._1_3_ = 0;
    uStack_10e0._4_4_ = ImageFormatUnknown;
    uStack_10c8 = 0;
    local_10e8[0] = pAVar2->resource_type;
    uVar12 = 5;
    if (local_10e8[0] != CBV) {
      if ((byte)(pAVar2->resource_kind - RawBuffer) < 2) {
        if (local_10e8[0] == UAV) {
          uStack_10e0._0_1_ = Invalid;
          uStack_10e0._1_3_ = 0;
          uStack_10e0._4_4_ = ImageFormatR32ui;
        }
      }
      else {
        bVar8 = pAVar2->component_type - SNormF16;
        uVar12 = (uint)(0xa0a09090808 >> (bVar8 * '\b' & 0x3f));
        if (5 < bVar8) {
          uVar12 = (uint)pAVar2->component_type;
        }
        if ((pAVar2->tracking).has_atomic_64bit != false) {
          uVar12 = 7;
        }
      }
    }
    actual_component_type = (ComponentType)uVar12;
    if (actual_component_type == F16) {
      local_10e8[1] = F32;
    }
    else if ((uVar12 & 0xff) == 3) {
      local_10e8[1] = U32;
    }
    else {
      local_10e8[1] = actual_component_type;
      if ((uVar12 & 0xff) == 2) {
        local_10e8[1] = I32;
      }
    }
    local_10e8._2_6_ = 0;
    RVar11 = pAVar2->resource_kind;
    uStack_10e0 = (pointer)CONCAT71(uStack_10e0._1_7_,RVar11);
    if ((actual_component_type == local_10e8[1]) || (6 < (byte)(actual_component_type - I16))) {
      bStack_10ce = false;
    }
    else {
      bStack_10ce = SUB81(0x1000000000101 >> ((actual_component_type - I16 & 7) << 3),0);
    }
    if (local_10e8[0] == UAV) {
      if (pAVar2->coherent == true) {
        (this->execution_mode_meta).declares_globallycoherent_uav = true;
      }
      cVar9 = pAVar2->rov;
      if ((bool)cVar9 == true) {
        (this->execution_mode_meta).declares_rov = true;
      }
      if ((this->shader_analysis).require_uav_thread_group_coherence == true) {
        pAVar2->coherent = true;
      }
      if ((byte)(RVar11 - RawBuffer) < 2) {
        (pAVar2->tracking).has_read = true;
        (pAVar2->tracking).has_written = true;
      }
      if (pAVar2->coherent != false) {
        cVar9 = '\x01';
      }
      uVar6._0_1_ = (pAVar2->tracking).has_read;
      uVar6._1_1_ = (pAVar2->tracking).has_written;
      local_10d8 = (pointer)((ulong)CONCAT12(cVar9,uVar6) << 0x20);
      bVar10 = get_uav_image_format
                         (this,RVar11,actual_component_type,&pAVar2->tracking,
                          (ImageFormat *)((long)&uStack_10e0 + 4));
      if (!bVar10) goto switchD_0011a91b_default;
    }
    RVar11 = (ResourceKind)uStack_10e0;
    uVar12 = -pAVar2->stride & pAVar2->stride;
    if ((ResourceKind)uStack_10e0 == RawBuffer) {
      uVar12 = 0x10;
    }
    local_107c = get_remapping_stage(this->execution_model);
    uStack_1078 = CONCAT31(uStack_1078._1_3_,RVar11);
    uStack_1074 = 0xffffffff00000000;
    uStack_106c = 0xffffffffffffffff;
    local_10b8 = (AnnotateHandleReference *)0x0;
    pRStack_10b0 = (pointer)0x0;
    local_10a8 = (pointer)0x0;
    pRVar4 = this->resource_mapping_iface;
    uStack_1064 = uVar12;
    if (pRVar4 == (ResourceRemappingInterface *)0x0) goto switchD_0011a91b_default;
    switch((ulong)local_10e8 & 0xff) {
    case 0:
      VStack_1020.root_constant_index = 0;
      VStack_1020.bindless.heap_root_offset._0_2_ = 0;
      VStack_1020.bindless.heap_root_offset._2_2_ = 0;
      VStack_1020.bindless.use_heap = false;
      VStack_1020.bindless._5_3_ = 0;
      VStack_1020.descriptor_type._0_2_ = Identity;
      VStack_1020.descriptor_type._2_2_ = Identity >> 0x10;
      local_1028 = (pointer)0x0;
      VStack_1020._0_6_ = 0;
      VStack_1020.binding._2_2_ = 0;
      local_1038 = (undefined1  [8])0x0;
      pRStack_1030 = (pointer)0x0;
      iVar13 = (*pRVar4->_vptr_ResourceRemappingInterface[2])
                         (pRVar4,&local_107c,(VulkanBinding *)local_1038);
      cVar9 = (char)iVar13;
      local_10b8 = (AnnotateHandleReference *)local_1038;
      pRStack_10b0 = pRStack_1030;
      local_10a8 = local_1028;
      bVar10 = get_ssbo_offset_buffer_id
                         (this,&pAVar2->offset_buffer_id,(VulkanBinding *)local_1038,&VStack_1020,
                          pAVar2->resource_kind,uVar12);
      goto joined_r0x0011abe1;
    case 1:
      local_1008[0].descriptor_set = 0;
      local_1008[0].binding = 0;
      local_1008[0].root_constant_index = 0;
      local_1008[0].bindless.heap_root_offset = 0;
      VStack_1020.root_constant_index = 0;
      VStack_1020.bindless.heap_root_offset._0_2_ = 0;
      VStack_1020.bindless.heap_root_offset._2_2_ = 0;
      VStack_1020.bindless.use_heap = false;
      VStack_1020.bindless._5_3_ = 0;
      VStack_1020.descriptor_type._0_2_ = Identity;
      VStack_1020.descriptor_type._2_2_ = Identity >> 0x10;
      local_1028 = (pointer)0x0;
      VStack_1020._0_6_ = 0;
      VStack_1020.binding._2_2_ = 0;
      local_1038 = (undefined1  [8])0x0;
      pRStack_1030 = (pointer)0x0;
      local_1008[0].bindless.use_heap = false;
      local_1008[0].bindless._5_3_ = 0;
      local_1008[0].descriptor_type = Identity;
      uStack_1054 = uStack_1078;
      uStack_1050 = 0;
      uStack_104c = 0xffffffff;
      uStack_1048 = 0xffffffff;
      uStack_1044 = 0xffffffff;
      local_103c = (uint)pAVar2->counter;
      local_1058 = local_107c;
      uStack_1040 = uVar12;
      iVar13 = (*pRVar4->_vptr_ResourceRemappingInterface[4])
                         (pRVar4,&local_1058,(VulkanBinding *)local_1038);
      cVar9 = (char)iVar13;
      local_10b8 = (AnnotateHandleReference *)local_1038;
      pRStack_10b0 = pRStack_1030;
      local_10a8 = local_1028;
      bVar10 = get_ssbo_offset_buffer_id
                         (this,&pAVar2->offset_buffer_id,(VulkanBinding *)local_1038,local_1008,
                          pAVar2->resource_kind,uVar12);
      if (!bVar10) goto switchD_0011a91b_default;
      if (pAVar2->counter == true) {
        local_1118.descriptor_type = Identity;
        local_1118.uav_read = false;
        local_1118.uav_written = false;
        local_1118.counters = false;
        local_1118.offsets = false;
        local_1118.aliased = false;
        local_1118.relaxed_precision = false;
        local_1118._27_1_ = 0;
        local_1118._9_2_ = 0;
        local_1118._11_1_ = 0;
        local_1118.format = ImageFormatUnknown;
        (pAVar2->counter_reference).push_constant_member = 0xffffffff;
        (pAVar2->counter_reference).stride = 4;
        (pAVar2->counter_reference).bindless = true;
        (pAVar2->counter_reference).base_resource_is_array = true;
        local_1118._0_8_ = (AnnotateHandleReference *)0x501;
        local_1118.desc_set = VStack_1020.descriptor_set;
        local_1118.binding =
             (uint32_t)(CONCAT26(VStack_1020.binding._2_2_,VStack_1020._0_6_) >> 0x20);
        if (((this->options).physical_storage_buffer == true) &&
           (CONCAT22(VStack_1020.descriptor_type._2_2_,(undefined2)VStack_1020.descriptor_type) != 2
           )) {
          local_1118.kind = Invalid;
          local_1118.counters = true;
          RVar11 = RawBuffer;
        }
        else {
          local_1118.kind = RawBuffer;
          local_1118.uav_read = true;
          local_1118.uav_written = true;
          local_1118.format = ImageFormatR32ui;
          RVar11 = TypedBuffer;
        }
        local_1118.uav_coherent = false;
        (pAVar2->counter_reference).resource_kind = RVar11;
        IVar14 = create_bindless_heap_variable(this,&local_1118);
        (pAVar2->counter_reference).var_id = IVar14;
      }
joined_r0x0011abe1:
      if (!bVar10) goto switchD_0011a91b_default;
      break;
    case 2:
      local_1118.descriptor_type = Identity;
      local_1118.uav_read = false;
      local_1118.uav_written = false;
      local_1118.uav_coherent = false;
      local_1118.counters = false;
      local_1118.offsets = false;
      local_1118.aliased = false;
      local_1118.relaxed_precision = false;
      local_1118._27_1_ = 0;
      local_1118._0_8_ = (AnnotateHandleReference *)0x0;
      local_1118.kind = Invalid;
      local_1118._9_2_ = 0;
      local_1118._11_1_ = 0;
      local_1118.format = ImageFormatUnknown;
      iVar13 = (*pRVar4->_vptr_ResourceRemappingInterface[5])(pRVar4,&local_107c,&local_1118);
      bVar10 = local_1118.offsets;
      cVar9 = (char)iVar13;
      if (local_1118.offsets == true) {
        p_Var16 = get_thread_log_callback();
        if (p_Var16 == (LoggingCallback)0x0) {
          emit_global_heaps();
        }
        else {
          VStack_1020.root_constant_index = 0x362e3620;
          VStack_1020.bindless.heap_root_offset._0_2_ = 0x6220;
          VStack_1020.bindless.heap_root_offset._2_2_ = 0x6e69;
          VStack_1020.bindless.use_heap = true;
          VStack_1020.bindless._5_3_ = 0x73656c;
          VStack_1020.descriptor_type._0_2_ = 0x2e73;
          VStack_1020.descriptor_type._2_2_ = 10;
          local_1028 = (pointer)0x746e6174736e6f63;
          VStack_1020._0_6_ = 0x20726f662073;
          VStack_1020.binding._2_2_ = 0x4d53;
          local_1038[0] = 'C';
          local_1038[1] = 'a';
          local_1038[2] = 'n';
          local_1038[3] = 'n';
          local_1038[4] = 'o';
          local_1038[5] = 't';
          local_1038[6] = ' ';
          local_1038[7] = 'u';
          pRStack_1030 = (pointer)0x2068737570206573;
          pvVar17 = get_thread_log_callback_userdata();
          (*p_Var16)(pvVar17,Error,local_1038);
        }
      }
      else {
        pRStack_10b0 = (pointer)CONCAT44(local_1118.format,
                                         CONCAT13(local_1118._11_1_,
                                                  CONCAT21(local_1118._9_2_,local_1118.kind)));
        local_10b8 = (AnnotateHandleReference *)local_1118._0_8_;
        local_10a8 = (pointer)CONCAT44(4,local_1118.descriptor_type);
      }
      if (bVar10 != false) goto switchD_0011a91b_default;
      break;
    case 3:
      iVar13 = (*pRVar4->_vptr_ResourceRemappingInterface[3])(pRVar4,&local_107c,&local_10b8);
      cVar9 = (char)iVar13;
      break;
    default:
      goto switchD_0011a91b_default;
    }
    if (cVar9 == '\0') goto switchD_0011a91b_default;
    if ((char)local_10a8 == '\0') {
      p_Var16 = get_thread_log_callback();
      if (p_Var16 == (LoggingCallback)0x0) {
        emit_global_heaps();
      }
      else {
        VStack_1020.root_constant_index = 0x62206562;
        VStack_1020.bindless.heap_root_offset._0_2_ = 0x6e69;
        VStack_1020.bindless.heap_root_offset._2_2_ = 0x6c64;
        VStack_1020.bindless.use_heap = true;
        VStack_1020.bindless._5_3_ = 0x2e7373;
        VStack_1020.descriptor_type._0_2_ = 10;
        local_1028 = (pointer)0x636e657265666572;
        VStack_1020._0_6_ = 0x73756d207365;
        VStack_1020.binding._2_2_ = 0x2074;
        local_1038[0] = 'S';
        local_1038[1] = 'M';
        local_1038[2] = ' ';
        local_1038[3] = '6';
        local_1038[4] = '.';
        local_1038[5] = '6';
        local_1038[6] = ' ';
        local_1038[7] = 'b';
        pRStack_1030 = (pointer)0x207373656c646e69;
        pvVar17 = get_thread_log_callback_userdata();
        (*p_Var16)(pvVar17,Error,local_1038);
      }
      goto switchD_0011a91b_default;
    }
    local_1118.desc_set = 0;
    local_1118._0_8_ = (AnnotateHandleReference *)0x0;
    local_1118.kind = Invalid;
    local_1118._9_2_ = 0;
    local_1118._11_1_ = 0;
    local_1118.format = ImageFormatUnknown;
    local_1118.descriptor_type = Identity;
    local_1118.uav_read = false;
    local_1118.uav_written = false;
    local_1118.uav_coherent = false;
    local_1118.counters = false;
    local_1118.offsets = false;
    local_1118.aliased = false;
    local_1118.relaxed_precision = false;
    bVar10 = analyze_aliased_access
                       (this,&pAVar2->tracking,local_10a8._4_4_,(AliasedAccess *)&local_1118);
    if (!bVar10) {
      if ((AnnotateHandleReference *)local_1118._0_8_ != (AnnotateHandleReference *)0x0) {
        free_in_thread((void *)local_1118._0_8_);
      }
      goto switchD_0011a91b_default;
    }
    uStack_10cc = (uint32_t)local_10b8;
    uStack_10c8 = (uint)((ulong)local_10b8 >> 0x20);
    local_10d8 = (pointer)CONCAT44(local_10d8._4_4_,local_10a8._4_4_);
    bStack_10cf = local_1118.offsets;
    (pAVar2->reference).bindless = true;
    (pAVar2->reference).base_resource_is_array = true;
    (pAVar2->reference).push_constant_member = 0xffffffff;
    (pAVar2->reference).stride = pAVar2->stride;
    (pAVar2->reference).resource_kind = pAVar2->resource_kind;
    bVar18 = true;
    if (pAVar2->coherent == false) {
      bVar18 = pAVar2->rov;
    }
    (pAVar2->reference).coherent = bVar18;
    (pAVar2->reference).rov = pAVar2->rov;
    if (local_1118.offsets == false) {
      if (local_1118.aliased == true) {
        pRStack_1030 = uStack_10e0;
        VStack_1020.root_constant_index = uStack_10c8;
        local_1028 = local_10d8;
        VStack_1020._0_6_ =
             SUB86(CONCAT44(uStack_10cc,
                            CONCAT13(uStack_10cd,CONCAT12(bStack_10ce,(ushort)bStack_10d0))),0);
        VStack_1020.binding._2_2_ = (undefined2)((ulong)local_10b8 >> 0x10);
        local_1038._2_6_ = local_10e8._2_6_;
        local_1038[0] = local_10e8[0];
        local_1038[1] = local_1118.relaxed_precision;
        local_1038._4_4_ = local_1118.desc_set;
        info = (BindlessInfo *)local_1038;
      }
      else {
        info = (BindlessInfo *)local_10e8;
      }
      IVar14 = create_bindless_heap_variable(this,info);
      (pAVar2->reference).var_id = IVar14;
    }
    else {
      create_bindless_heap_variable_alias_group
                ((Vector<Converter::Impl::RawDeclarationVariable> *)local_1038,this,
                 (BindlessInfo *)local_10e8,(Vector<RawDeclaration> *)&local_1118);
      ptr = (pAVar2->reference).var_alias_group.
            super__Vector_base<dxil_spv::Converter::Impl::RawDeclarationVariable,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclarationVariable>_>
            ._M_impl.super__Vector_impl_data._M_start;
      (pAVar2->reference).var_alias_group.
      super__Vector_base<dxil_spv::Converter::Impl::RawDeclarationVariable,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclarationVariable>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)local_1038;
      (pAVar2->reference).var_alias_group.
      super__Vector_base<dxil_spv::Converter::Impl::RawDeclarationVariable,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclarationVariable>_>
      ._M_impl.super__Vector_impl_data._M_finish = pRStack_1030;
      (pAVar2->reference).var_alias_group.
      super__Vector_base<dxil_spv::Converter::Impl::RawDeclarationVariable,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclarationVariable>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = local_1028;
      local_1038 = (undefined1  [8])0x0;
      pRStack_1030 = (pointer)0x0;
      local_1028 = (pointer)0x0;
      if (ptr != (pointer)0x0) {
        free_in_thread(ptr);
      }
      if (local_1038 != (undefined1  [8])0x0) {
        free_in_thread((void *)local_1038);
      }
    }
    (pAVar2->reference).aliased = local_1118.offsets;
    if ((AnnotateHandleReference *)local_1118._0_8_ != (AnnotateHandleReference *)0x0) {
      free_in_thread((void *)local_1118._0_8_);
    }
    if (!bVar10) goto switchD_0011a91b_default;
    ppAVar20 = ppAVar20 + 1;
    bVar23 = ppAVar20 == local_1060;
  } while( true );
}

Assistant:

bool Converter::Impl::emit_global_heaps()
{
	Vector<AnnotateHandleReference *> annotations;
	for (auto &use : llvm_annotate_handle_uses)
		annotations.push_back(&use.second);

	// Ensure reproducible codegen since we iterate over an unordered map.
	std::sort(annotations.begin(), annotations.end(),
	          [](const AnnotateHandleReference *a, const AnnotateHandleReference *b) {
	              return a->ordinal < b->ordinal;
	          });

	for (auto *annotation : annotations)
	{
		BindlessInfo info = {};

		auto actual_component_type = DXIL::ComponentType::U32;
		info.format = spv::ImageFormatUnknown;
		if (annotation->resource_type != DXIL::ResourceType::CBV &&
		    annotation->resource_kind != DXIL::ResourceKind::RawBuffer &&
		    annotation->resource_kind != DXIL::ResourceKind::StructuredBuffer)
		{
			actual_component_type = normalize_component_type(annotation->component_type);
			if (annotation->tracking.has_atomic_64bit)
			{
				// The component type in DXIL is u32, even if the resource itself is u64 in meta reflection data ...
				// This is also the case for signed components. Always use R64UI here.
				actual_component_type = DXIL::ComponentType::U64;
			}
		}
		else if (annotation->resource_type == DXIL::ResourceType::UAV)
		{
			info.format = spv::ImageFormatR32ui;
		}

		auto effective_component_type = get_effective_typed_resource_type(actual_component_type);

		info.type = annotation->resource_type;
		info.component = effective_component_type;
		info.kind = annotation->resource_kind;
		info.relaxed_precision = actual_component_type != effective_component_type &&
		                         component_type_is_16bit(actual_component_type);

		if (info.type == DXIL::ResourceType::UAV)
		{
			// See emit_uavs() for details around coherent and memory model shenanigans ...
			if (annotation->coherent)
				execution_mode_meta.declares_globallycoherent_uav = true;
			if (annotation->rov)
				execution_mode_meta.declares_rov = true;

			// Do not attempt to track read and write here to figure out if this resource in particular needs to be coherent.
			// It's plausible that the write and read can happen across
			// two different accesses to ResourceDescriptorHeap[]. Don't take any chances here ...
			if (shader_analysis.require_uav_thread_group_coherence)
				annotation->coherent = true;

			if (annotation->resource_kind == DXIL::ResourceKind::StructuredBuffer ||
			    annotation->resource_kind == DXIL::ResourceKind::RawBuffer)
			{
				// In case there is aliasing through different declarations,
				// we cannot emit NonWritable or NonReadable safely. Assume full read-write.
				// Be a bit careful with typed resources since it's not always supported with read-write + typed.
				annotation->tracking.has_read = true;
				annotation->tracking.has_written = true;
			}

			info.uav_coherent = annotation->coherent || annotation->rov;
			info.uav_read = annotation->tracking.has_read;
			info.uav_written = annotation->tracking.has_written;
			if (!get_uav_image_format(annotation->resource_kind, actual_component_type,
			                          annotation->tracking, info.format))
			{
				return false;
			}
		}

		unsigned stride = annotation->stride;
		unsigned alignment = info.kind == DXIL::ResourceKind::RawBuffer ? 16 : (stride & -int(stride));
		D3DBinding d3d_binding = {
			get_remapping_stage(execution_model), info.kind, 0,
			UINT32_MAX, UINT32_MAX, UINT32_MAX, alignment,
		};
		VulkanBinding vulkan_binding = {};

		bool remap_success = false;
		if (resource_mapping_iface)
		{
			switch (info.type)
			{
			case DXIL::ResourceType::SRV:
			{
				VulkanSRVBinding vulkan_srv_binding = {};
				remap_success = resource_mapping_iface->remap_srv(d3d_binding, vulkan_srv_binding);
				vulkan_binding = vulkan_srv_binding.buffer_binding;
				if (!get_ssbo_offset_buffer_id(annotation->offset_buffer_id, vulkan_srv_binding.buffer_binding,
				                               vulkan_srv_binding.offset_binding, annotation->resource_kind, alignment))
				{
					return false;
				}
				break;
			}

			case DXIL::ResourceType::UAV:
			{
				VulkanUAVBinding vulkan_uav_binding = {};
				D3DUAVBinding d3d_uav_binding = {};

				d3d_uav_binding.binding = d3d_binding;
				d3d_uav_binding.counter = annotation->counter;

				remap_success = resource_mapping_iface->remap_uav(d3d_uav_binding, vulkan_uav_binding);
				vulkan_binding = vulkan_uav_binding.buffer_binding;
				if (!get_ssbo_offset_buffer_id(annotation->offset_buffer_id, vulkan_uav_binding.buffer_binding,
											   vulkan_uav_binding.offset_binding, annotation->resource_kind, alignment))
				{
					return false;
				}

				if (annotation->counter)
				{
					auto &counter_binding = vulkan_uav_binding.counter_binding;
					BindlessInfo counter_info = {};

					annotation->counter_reference.base_resource_is_array = true;
					annotation->counter_reference.push_constant_member = UINT32_MAX;
					annotation->counter_reference.stride = 4;
					annotation->counter_reference.bindless = true;

					counter_info.type = DXIL::ResourceType::UAV;
					counter_info.component = DXIL::ComponentType::U32;
					counter_info.desc_set = counter_binding.descriptor_set;
					counter_info.binding = counter_binding.binding;

					if (options.physical_storage_buffer &&
					    counter_binding.descriptor_type != VulkanDescriptorType::TexelBuffer)
					{
						counter_info.kind = DXIL::ResourceKind::Invalid;
						counter_info.counters = true;
						annotation->counter_reference.resource_kind = DXIL::ResourceKind::RawBuffer;
					}
					else
					{
						counter_info.kind = DXIL::ResourceKind::RawBuffer;
						counter_info.uav_read = true;
						counter_info.uav_written = true;
						counter_info.uav_coherent = false;
						counter_info.format = spv::ImageFormatR32ui;
						annotation->counter_reference.resource_kind = DXIL::ResourceKind::TypedBuffer;
					}

					annotation->counter_reference.var_id = create_bindless_heap_variable(counter_info);
				}
				break;
			}

			case DXIL::ResourceType::CBV:
			{
				VulkanCBVBinding vulkan_cbv_binding = {};
				remap_success = resource_mapping_iface->remap_cbv(d3d_binding, vulkan_cbv_binding);
				if (vulkan_cbv_binding.push_constant)
				{
					LOGE("Cannot use push constants for SM 6.6 bindless.\n");
					return false;
				}
				vulkan_binding = vulkan_cbv_binding.buffer;
				vulkan_binding.descriptor_type = VulkanDescriptorType::UBO;
				break;
			}

			case DXIL::ResourceType::Sampler:
				remap_success = resource_mapping_iface->remap_sampler(d3d_binding, vulkan_binding);
				break;
			}
		}

		if (!remap_success)
			return false;

		if (!vulkan_binding.bindless.use_heap)
		{
			LOGE("SM 6.6 bindless references must be bindless.\n");
			return false;
		}

		AliasedAccess aliased_access;
		if (!analyze_aliased_access(annotation->tracking, vulkan_binding.descriptor_type, aliased_access))
			return false;

		info.desc_set = vulkan_binding.descriptor_set;
		info.binding = vulkan_binding.binding;
		info.descriptor_type = vulkan_binding.descriptor_type;
		info.aliased = aliased_access.requires_alias_decoration;

		annotation->reference.bindless = true;
		annotation->reference.base_resource_is_array = true;
		annotation->reference.push_constant_member = UINT32_MAX;
		annotation->reference.stride = annotation->stride;
		annotation->reference.resource_kind = annotation->resource_kind;
		annotation->reference.coherent = annotation->coherent || annotation->rov;
		annotation->reference.rov = annotation->rov;

		if (aliased_access.requires_alias_decoration)
		{
			annotation->reference.var_alias_group = create_bindless_heap_variable_alias_group(
			    info, aliased_access.raw_declarations);
		}
		else if (aliased_access.override_primary_component_types)
		{
			auto tmp_info = info;
			tmp_info.component = aliased_access.primary_component_type;
			tmp_info.raw_vecsize = aliased_access.primary_raw_vecsize;
			annotation->reference.var_id = create_bindless_heap_variable(tmp_info);
		}
		else
			annotation->reference.var_id = create_bindless_heap_variable(info);

		annotation->reference.aliased = aliased_access.requires_alias_decoration;
	}

	return true;
}